

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall cmMakefile::PlatformIsAppleSimulator(cmMakefile *this)

{
  size_type sVar1;
  initializer_list<cmMakefile::AppleSDK> __l;
  allocator_type local_4e;
  less<cmMakefile::AppleSDK> local_4d;
  AppleSDK local_4c;
  _Rb_tree<cmMakefile::AppleSDK,_cmMakefile::AppleSDK,_std::_Identity<cmMakefile::AppleSDK>,_std::less<cmMakefile::AppleSDK>,_std::allocator<cmMakefile::AppleSDK>_>
  local_48;
  AppleSDK local_18 [4];
  
  local_18[0] = AppleTVSimulator;
  local_18[1] = IPhoneSimulator;
  local_18[2] = WatchSimulator;
  local_18[3] = XRSimulator;
  __l._M_len = 4;
  __l._M_array = local_18;
  std::
  set<cmMakefile::AppleSDK,_std::less<cmMakefile::AppleSDK>,_std::allocator<cmMakefile::AppleSDK>_>
  ::set((set<cmMakefile::AppleSDK,_std::less<cmMakefile::AppleSDK>,_std::allocator<cmMakefile::AppleSDK>_>
         *)&local_48,__l,&local_4d,&local_4e);
  local_4c = GetAppleSDKType(this);
  sVar1 = std::
          set<cmMakefile::AppleSDK,_std::less<cmMakefile::AppleSDK>,_std::allocator<cmMakefile::AppleSDK>_>
          ::count((set<cmMakefile::AppleSDK,_std::less<cmMakefile::AppleSDK>,_std::allocator<cmMakefile::AppleSDK>_>
                   *)&local_48,&local_4c);
  std::
  _Rb_tree<cmMakefile::AppleSDK,_cmMakefile::AppleSDK,_std::_Identity<cmMakefile::AppleSDK>,_std::less<cmMakefile::AppleSDK>,_std::allocator<cmMakefile::AppleSDK>_>
  ::~_Rb_tree(&local_48);
  return sVar1 != 0;
}

Assistant:

bool cmMakefile::PlatformIsAppleSimulator() const
{
  return std::set<AppleSDK>{
    AppleSDK::AppleTVSimulator,
    AppleSDK::IPhoneSimulator,
    AppleSDK::WatchSimulator,
    AppleSDK::XRSimulator,
  }
    .count(this->GetAppleSDKType());
}